

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  ssh_cipheralg *psVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  LR LVar8;
  byte bVar9;
  undefined1 *puVar10;
  byte local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  int local_54;
  ssh_cipher *local_50;
  des_keysched *local_48;
  des_keysched *local_40;
  des_keysched *local_38;
  
  local_50 = ciph;
  if (0 < len) {
    local_38 = (des_keysched *)(ciph + -0x31);
    local_40 = (des_keysched *)(ciph + -0x21);
    local_48 = (des_keysched *)(ciph + -0x11);
    iVar5 = len + 8;
    puVar10 = (undefined1 *)((long)vdata + 7);
    do {
      psVar1 = local_50[-1].vt;
      bVar9 = (byte)((ulong)psVar1 >> 0x38);
      local_50[-1].vt = (ssh_cipheralg *)((long)&psVar1->new + 1);
      uVar2 = (uint)((ulong)psVar1 >> 0x20);
      uVar2 = (uint)bVar9 << 0x18 | uVar2 & 0xff | uVar2 & 0xff00 | uVar2 & 0xff0000;
      uVar6 = (uint)psVar1 & 0xffff |
              (uint)psVar1 & 0xff0000 | (uint)((((ulong)psVar1 >> 0x18) << 0x38) >> 0x20);
      uVar4 = (uVar2 >> 4 ^ uVar6) & 0xf0f0f0f;
      uVar2 = uVar4 << 4 ^ uVar2;
      uVar4 = uVar4 ^ uVar6;
      uVar6 = uVar4 & 0xffff ^ uVar2 >> 0x10;
      uVar2 = uVar6 << 0x10 ^ uVar2;
      uVar6 = uVar6 ^ uVar4;
      uVar4 = (uVar6 >> 2 ^ uVar2) & 0x33333333;
      uVar6 = uVar4 * 4 ^ uVar6;
      uVar4 = uVar4 ^ uVar2;
      uVar2 = (uVar6 >> 8 ^ uVar4) & 0xff00ff;
      uVar6 = uVar2 << 8 ^ uVar6;
      uVar2 = uVar2 ^ uVar4;
      uVar4 = (uVar2 >> 1 ^ uVar6) & 0x55555555;
      uVar2 = uVar4 * 2 ^ uVar2;
      uVar4 = uVar4 ^ uVar6;
      LVar8.L = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
      LVar8.R = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
      local_54 = iVar5;
      LVar8 = des_inner_cipher(LVar8,local_38,0,1);
      LVar8 = des_inner_cipher(LVar8,local_40,0xf,0xffffffffffffffff);
      LVar8 = des_inner_cipher(LVar8,local_48,0,1);
      uVar2 = LVar8.L;
      uVar4 = LVar8.R << 1 | (uint)((long)LVar8 < 0);
      uVar6 = (uVar2 & 0x7fffffff ^ uVar4) & 0x55555555;
      uVar7 = uVar6 * 2 ^ (uVar2 << 1 | (uint)((int)uVar2 < 0));
      uVar6 = uVar6 ^ uVar4;
      uVar2 = (uVar6 >> 8 ^ uVar7) & 0xff00ff;
      uVar6 = uVar2 << 8 ^ uVar6;
      uVar2 = uVar2 ^ uVar7;
      uVar4 = (uVar6 >> 2 ^ uVar2) & 0x33333333;
      uVar6 = uVar4 * 4 ^ uVar6;
      uVar4 = uVar4 ^ uVar2;
      uVar7 = uVar6 & 0xffff ^ uVar4 >> 0x10;
      uVar4 = uVar7 << 0x10 ^ uVar4;
      uVar7 = uVar7 ^ uVar6;
      uVar6 = (uVar4 >> 4 ^ uVar7) & 0xf0f0f0f;
      uVar2 = *(uint *)(puVar10 + -7);
      uVar3 = CONCAT17(puVar10[-3],
                       CONCAT16(puVar10[-2],
                                CONCAT15(puVar10[-1],
                                         CONCAT14(*puVar10,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 |
                                                           (uVar2 & 0xff00) << 8 | uVar2 << 0x18))))
              ^ CONCAT44(uVar6 ^ uVar7,uVar6 << 4 ^ uVar4);
      *(ushort *)(puVar10 + -5) = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
      puVar10[-6] = (char)(uVar3 >> 0x10);
      puVar10[-7] = (char)(uVar3 >> 0x18);
      *puVar10 = (char)(uVar3 >> 0x20);
      puVar10[-1] = (char)(uVar3 >> 0x28);
      puVar10[-2] = (char)(uVar3 >> 0x30);
      puVar10[-3] = (char)(uVar3 >> 0x38);
      iVar5 = local_54 + -8;
      puVar10 = puVar10 + 8;
    } while (8 < iVar5);
    local_55 = SUB81(psVar1,0);
    local_56 = (undefined1)((ulong)psVar1 >> 8);
    local_57 = (undefined1)((ulong)psVar1 >> 0x10);
    local_58 = (undefined1)((ulong)psVar1 >> 0x18);
    local_5a = (undefined1)((ulong)psVar1 >> 0x28);
    local_5b = (undefined1)((ulong)psVar1 >> 0x30);
    local_59 = (char)((ulong)psVar1 >> 0x20);
    local_5c = bVar9;
  }
  smemclr(&local_5c,8);
  return;
}

Assistant:

static void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_sdctr_ctx *ctx = container_of(
        ciph, struct des3_sdctr_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    uint8_t iv_buf[8];
    for (; len > 0; len -= 8, data += 8) {
        /* Format the counter value into the buffer. */
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            PUT_BIGNUMINT_MSB_FIRST(
                iv_buf + 8 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                ctx->counter[i]);

        /* Increment the counter. */
        BignumCarry carry = 1;
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            BignumADC(ctx->counter[i], carry, ctx->counter[i], 0, carry);

        /* Triple-encrypt the counter value from the IV. */
        LR lr = des_IP(des_load_lr(iv_buf));
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        LR keystream = des_FP(lr);

        LR input = des_load_lr(data);
        LR output = des_xor_lr(input, keystream);
        des_store_lr(data, output);
    }
    smemclr(iv_buf, sizeof(iv_buf));
}